

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateBuilder
          (ImmutableMessageGenerator *this,Printer *printer)

{
  MessageBuilderGenerator builderGenerator;
  MessageBuilderGenerator MStack_88;
  
  io::Printer::Print<>
            (printer,
             "@java.lang.Override\npublic Builder newBuilderForType() { return newBuilder(); }\n");
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&MStack_88,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "public static Builder newBuilder() {\n  return DEFAULT_INSTANCE.toBuilder();\n}\npublic static Builder newBuilder($classname$ prototype) {\n  return DEFAULT_INSTANCE.toBuilder().mergeFrom(prototype);\n}\n@java.lang.Override\npublic Builder toBuilder() {\n  return this == DEFAULT_INSTANCE\n      ? new Builder() : new Builder().mergeFrom(this);\n}\n\n"
             ,(char (*) [10])0x3dd2a7,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&MStack_88);
  std::__cxx11::string::~string((string *)&MStack_88);
  GeneratedCodeVersionSuffix_abi_cxx11_();
  io::Printer::Print<char[4],std::__cxx11::string>
            (printer,
             "@java.lang.Override\nprotected Builder newBuilderForType(\n    com.google.protobuf.GeneratedMessage$ver$.BuilderParent parent) {\n  Builder builder = new Builder(parent);\n  return builder;\n}\n"
             ,(char (*) [4])0x3cdf4b,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&MStack_88);
  std::__cxx11::string::~string((string *)&MStack_88);
  MessageBuilderGenerator::MessageBuilderGenerator
            (&MStack_88,(this->super_MessageGenerator).descriptor_,this->context_);
  MessageBuilderGenerator::Generate(&MStack_88,printer);
  MessageBuilderGenerator::~MessageBuilderGenerator(&MStack_88);
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateBuilder(io::Printer* printer) {
  // LITE_RUNTIME implements this at the GeneratedMessageLite level.
  printer->Print(
      "@java.lang.Override\n"
      "public Builder newBuilderForType() { return newBuilder(); }\n");

  printer->Print(
      "public static Builder newBuilder() {\n"
      "  return DEFAULT_INSTANCE.toBuilder();\n"
      "}\n"
      "public static Builder newBuilder($classname$ prototype) {\n"
      "  return DEFAULT_INSTANCE.toBuilder().mergeFrom(prototype);\n"
      "}\n"
      "@java.lang.Override\n"
      "public Builder toBuilder() {\n"
      "  return this == DEFAULT_INSTANCE\n"
      "      ? new Builder() : new Builder().mergeFrom(this);\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "@java.lang.Override\n"
      "protected Builder newBuilderForType(\n"
      "    com.google.protobuf.GeneratedMessage$ver$.BuilderParent parent) {\n"
      "  Builder builder = new Builder(parent);\n"
      "  return builder;\n"
      "}\n",
      "ver", GeneratedCodeVersionSuffix());

  MessageBuilderGenerator builderGenerator(descriptor_, context_);
  builderGenerator.Generate(printer);
}